

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZLinearAnalysis.cpp
# Opt level: O1

TPZMatrixSolver<double> * __thiscall
TPZLinearAnalysis::MatrixSolver<double>(TPZLinearAnalysis *this)

{
  TPZSolver *pTVar1;
  TPZMatrixSolver<double> *pTVar2;
  
  pTVar1 = (this->super_TPZAnalysis).fSolver;
  if (pTVar1 == (TPZSolver *)0x0) {
    pTVar2 = (TPZMatrixSolver<double> *)0x0;
  }
  else {
    pTVar2 = (TPZMatrixSolver<double> *)
             __dynamic_cast(pTVar1,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  }
  if (pTVar2 == (TPZMatrixSolver<double> *)0x0 && pTVar1 != (TPZSolver *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver() [TVar = double]",0x48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," incompatible Solver type! Aborting\n",0x24);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZLinearAnalysis.cpp"
               ,0x125);
  }
  return pTVar2;
}

Assistant:

TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver(){
    const auto tmp = dynamic_cast<TPZMatrixSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}